

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

bool wasm::Debug::hasDWARFSections(Module *wasm)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  pointer str;
  char *extraout_RDX;
  CustomSection *section;
  Name name;
  IString local_30;
  
  pCVar1 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar2 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    str = pCVar2;
    if (str == pCVar1) break;
    IString::IString(&local_30,&str->name);
    name.super_IString.str._M_str = extraout_RDX;
    name.super_IString.str._M_len = (size_t)local_30.str._M_str;
    bVar3 = isDWARFSection((Debug *)local_30.str._M_len,name);
    pCVar2 = str + 1;
  } while (!bVar3);
  return str != pCVar1;
}

Assistant:

bool hasDWARFSections(const Module& wasm) {
  for (auto& section : wasm.customSections) {
    if (isDWARFSection(section.name)) {
      return true;
    }
  }
  return false;
}